

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O0

grid_split * idx2::SplitAlternate(grid_split *__return_storage_ptr__,grid *Grid,dimension D)

{
  u64 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined8 local_2d8;
  v3i NewStrd3;
  v3i Mask3;
  undefined8 local_2ac;
  v3i From3;
  undefined8 local_290;
  v3i Strd3;
  undefined8 local_270;
  v3i Dims3;
  dimension D_local;
  grid *Grid_local;
  undefined8 local_a4;
  undefined8 local_98;
  uint local_90;
  u64 local_88;
  undefined8 local_7c;
  undefined8 local_70;
  uint local_68;
  u64 local_60;
  undefined8 local_58;
  uint local_4c;
  int local_48;
  int local_44;
  undefined8 *local_40;
  uint local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  uint local_1c;
  int local_18;
  int local_14;
  undefined8 *local_10;
  
  local_60 = (Grid->super_extent).Dims;
  local_44 = ((int)local_60 << 0xb) >> 0xb;
  local_48 = (int)((long)(local_60 << 0x16) >> 0x2b);
  uVar5 = (uint)((long)(local_60 * 2) >> 0x2b);
  local_58._0_4_ = local_44;
  local_58._4_4_ = local_48;
  NewStrd3.field_0.field_4.YZ.field_0 = (v2<int>)local_58;
  local_70 = NewStrd3.field_0.field_4.YZ.field_0;
  stack0xfffffffffffffd80 = NewStrd3.field_0.field_4.YZ.field_0;
  local_270 = NewStrd3.field_0.field_4.YZ.field_0;
  uVar1 = Grid->Strd;
  local_14 = ((int)uVar1 << 0xb) >> 0xb;
  local_18 = (int)((long)(uVar1 << 0x16) >> 0x2b);
  uVar6 = (uint)((long)(uVar1 * 2) >> 0x2b);
  local_a4._0_4_ = local_14;
  local_a4._4_4_ = local_18;
  uVar2 = local_a4;
  From3.field_0._4_8_ = uVar2;
  local_290 = uVar2;
  local_88 = (Grid->super_extent).From;
  local_2c = ((int)local_88 << 0xb) >> 0xb;
  local_30 = (int)((long)(local_88 << 0x16) >> 0x2b);
  uVar7 = (uint)((long)(local_88 * 2) >> 0x2b);
  local_7c._0_4_ = local_2c;
  local_7c._4_4_ = local_30;
  uVar4 = local_7c;
  local_98 = uVar4;
  local_2ac = uVar4;
  From3.field_0.field_0.X = uVar7;
  Strd3.field_0.field_0.X = uVar6;
  Dims3.field_0.field_0.X = uVar5;
  Dims3.field_0.field_0.Y = D;
  unique0x10000968 = Grid;
  local_90 = uVar7;
  local_68 = uVar5;
  local_4c = uVar5;
  local_40 = &local_58;
  local_34 = uVar7;
  local_28 = &local_7c;
  local_1c = uVar6;
  local_10 = &local_a4;
  if (2 < (int)D) {
    __assert_fail("Idx < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
  }
  if (2 < (int)D) {
    __assert_fail("Idx < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
  }
  *(int *)((long)&local_2ac + (long)(int)D * 4) =
       *(int *)((long)&local_290 + (long)(int)D * 4) + *(int *)((long)&local_2ac + (long)(int)D * 4)
  ;
  (__return_storage_ptr__->First).super_extent.From = (Grid->super_extent).From;
  (__return_storage_ptr__->First).super_extent.Dims = (Grid->super_extent).Dims;
  (__return_storage_ptr__->First).Strd = Grid->Strd;
  (__return_storage_ptr__->Second).super_extent.From = (Grid->super_extent).From;
  (__return_storage_ptr__->Second).super_extent.Dims = (Grid->super_extent).Dims;
  (__return_storage_ptr__->Second).Strd = Grid->Strd;
  uVar3 = NewStrd3.field_0._4_8_;
  if (2 < (int)D) {
    __assert_fail("Idx < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
  }
  if (2 < (int)D) {
    __assert_fail("Idx < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
  }
  *(int *)((long)&NewStrd3.field_0 + (long)(int)D * 4 + 4) =
       *(int *)((long)&local_270 + (long)(int)D * 4) + 1 >> 1;
  NewStrd3.field_0.field_0.Z = (int)((ulong)NewStrd3.field_0.field_4.YZ.field_0 >> 0x20);
  (__return_storage_ptr__->First).super_extent.Dims =
       (long)(int)(NewStrd3.field_0.field_0.Y & 0x1fffff) +
       (long)(int)(NewStrd3.field_0.field_0.Z & 0x1fffff) * 0x200000 +
       ((long)(int)(uVar5 & 0x1fffff) << 0x2a);
  local_2d8 = uVar2;
  NewStrd3.field_0._4_8_ = uVar3;
  NewStrd3.field_0._0_4_ = uVar6;
  if (2 < (int)D) {
    __assert_fail("Idx < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
  }
  *(int *)((long)&local_2d8 + (long)(int)D * 4) = *(int *)((long)&local_2d8 + (long)(int)D * 4) << 1
  ;
  local_2d8._0_4_ = (uint)uVar2;
  local_2d8._4_4_ = (uint)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->First).Strd =
       (long)(int)((uint)local_2d8 & 0x1fffff) + (long)(int)(local_2d8._4_4_ & 0x1fffff) * 0x200000
       + ((long)(int)(uVar6 & 0x1fffff) << 0x2a);
  local_2d8 = uVar2;
  if (2 < (int)D) {
    __assert_fail("Idx < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
  }
  if (2 < (int)D) {
    __assert_fail("Idx < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
  }
  if (2 < (int)D) {
    __assert_fail("Idx < 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
  }
  *(int *)((long)&NewStrd3.field_0 + (long)(int)D * 4 + 4) =
       *(int *)((long)&local_270 + (long)(int)D * 4) -
       *(int *)((long)&NewStrd3.field_0 + (long)(int)D * 4 + 4);
  (__return_storage_ptr__->Second).super_extent.Dims =
       (long)(int)(NewStrd3.field_0.field_0.Y & 0x1fffff) +
       (long)(int)(NewStrd3.field_0.field_0.Z & 0x1fffff) * 0x200000 +
       ((long)(int)(uVar5 & 0x1fffff) << 0x2a);
  (__return_storage_ptr__->Second).Strd =
       (long)(int)((uint)local_2d8 & 0x1fffff) + (long)(int)(local_2d8._4_4_ & 0x1fffff) * 0x200000
       + ((long)(int)(uVar6 & 0x1fffff) << 0x2a);
  local_2ac._0_4_ = (uint)uVar4;
  local_2ac._4_4_ = (uint)((ulong)uVar4 >> 0x20);
  (__return_storage_ptr__->Second).super_extent.From =
       (long)(int)((uint)local_2ac & 0x1fffff) + (long)(int)(local_2ac._4_4_ & 0x1fffff) * 0x200000
       + ((long)(int)(uVar7 & 0x1fffff) << 0x2a);
  return __return_storage_ptr__;
}

Assistant:

grid_split
SplitAlternate(const grid& Grid, dimension D)
{
  v3i Dims3 = Dims(Grid);
  v3i Strd3 = Strd(Grid);
  v3i From3 = From(Grid);
  From3[D] += Strd3[D];
  grid_split GridSplit{ Grid, Grid };
  v3i Mask3 = Dims3;
  Mask3[D] = (Dims3[D] + 1) >> 1;
  SetDims(&GridSplit.First, Mask3);
  v3i NewStrd3 = Strd3;
  NewStrd3[D] <<= 1;
  SetStrd(&GridSplit.First, NewStrd3);
  Mask3[D] = Dims3[D] - Mask3[D];
  SetDims(&GridSplit.Second, Mask3);
  SetStrd(&GridSplit.Second, NewStrd3);
  SetFrom(&GridSplit.Second, From3);
  return GridSplit;
}